

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

RunnerContext * RunFuncWithArgs(Runner *runner,ASTNode *func,ASTList *args)

{
  ASTListItem *pAVar1;
  RunnerContext *pRVar2;
  int iVar3;
  int iVar4;
  ASTListItem *pAVar5;
  
  pAVar5 = args->first;
  if (pAVar5 != (ASTListItem *)0x0) {
    iVar4 = 1;
    do {
      pRVar2 = SetNodeValue(runner,pAVar5->node);
      iVar3 = iVar4;
      for (pAVar1 = ((func->meta).funcExpr.params)->first; pAVar1 != (ASTListItem *)0x0;
          pAVar1 = pAVar1->next) {
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) {
          pRVar2->node = pAVar1->node;
          break;
        }
      }
      pAVar5 = pAVar5->next;
      iVar4 = iVar4 + 1;
    } while (pAVar5 != (ASTListItem *)0x0);
  }
  pRVar2 = Run(runner,(func->meta).funcExpr.body);
  GCScope(runner,(func->meta).funcExpr.body);
  for (pAVar5 = ((func->meta).funcExpr.params)->first; pAVar5 != (ASTListItem *)0x0;
      pAVar5 = pAVar5->next) {
    GCContextByNodeId(runner,pAVar5->node->id);
  }
  return pRVar2;
}

Assistant:

RunnerContext* RunFuncWithArgs(Runner* runner, ASTNode* func, ASTList* args){
  DEBUG_PRINT_RUNNER("Function Scope")

  int argIdx = 0;
  FOREACH_AST(args){
    ASTNode* arg = item->node;
    int paramIdx = 0;
    RunnerContext* context = SetNodeValue(runner, arg);

    FOREACH_AST(GET_FUNC_PARAMS(func)){
      if (argIdx == paramIdx++){
        ASTNode* param = item->node;
        context->node = param;
        break;
      }
    }

    argIdx++;
  }

  RunnerContext* context = Run(runner, GET_FUNC_BODY(func));
  GCScope(runner, GET_FUNC_BODY(func));
  GCAstList(runner, GET_FUNC_PARAMS(func));
  return context;
}